

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QTextHtmlParser::ExternalStyleSheet>::moveAppend
          (QGenericArrayOps<QTextHtmlParser::ExternalStyleSheet> *this,ExternalStyleSheet *b,
          ExternalStyleSheet *e)

{
  qsizetype *pqVar1;
  ExternalStyleSheet *pEVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  StyleRule *pSVar8;
  Data *pDVar9;
  MediaRule *pMVar10;
  Data *pDVar11;
  PageRule *pPVar12;
  Data *pDVar13;
  AnimationRule *pAVar14;
  Data *pDVar15;
  ImportRule *pIVar16;
  Data *pDVar17;
  int iVar18;
  
  if ((b != e) && (b < e)) {
    pEVar2 = (this->super_QArrayDataPointer<QTextHtmlParser::ExternalStyleSheet>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QTextHtmlParser::ExternalStyleSheet>).size;
      pDVar4 = (b->url).d.d;
      (b->url).d.d = (Data *)0x0;
      pEVar2[lVar3].url.d.d = pDVar4;
      pcVar5 = (b->url).d.ptr;
      (b->url).d.ptr = (char16_t *)0x0;
      pEVar2[lVar3].url.d.ptr = pcVar5;
      qVar6 = (b->url).d.size;
      (b->url).d.size = 0;
      pEVar2[lVar3].url.d.size = qVar6;
      pDVar7 = (b->sheet).styleRules.d.d;
      (b->sheet).styleRules.d.d = (Data *)0x0;
      pEVar2[lVar3].sheet.styleRules.d.d = pDVar7;
      pSVar8 = (b->sheet).styleRules.d.ptr;
      (b->sheet).styleRules.d.ptr = (StyleRule *)0x0;
      pEVar2[lVar3].sheet.styleRules.d.ptr = pSVar8;
      qVar6 = (b->sheet).styleRules.d.size;
      (b->sheet).styleRules.d.size = 0;
      pEVar2[lVar3].sheet.styleRules.d.size = qVar6;
      pDVar9 = (b->sheet).mediaRules.d.d;
      (b->sheet).mediaRules.d.d = (Data *)0x0;
      pEVar2[lVar3].sheet.mediaRules.d.d = pDVar9;
      pMVar10 = (b->sheet).mediaRules.d.ptr;
      (b->sheet).mediaRules.d.ptr = (MediaRule *)0x0;
      pEVar2[lVar3].sheet.mediaRules.d.ptr = pMVar10;
      qVar6 = (b->sheet).mediaRules.d.size;
      (b->sheet).mediaRules.d.size = 0;
      pEVar2[lVar3].sheet.mediaRules.d.size = qVar6;
      pDVar11 = (b->sheet).pageRules.d.d;
      (b->sheet).pageRules.d.d = (Data *)0x0;
      pEVar2[lVar3].sheet.pageRules.d.d = pDVar11;
      pPVar12 = (b->sheet).pageRules.d.ptr;
      (b->sheet).pageRules.d.ptr = (PageRule *)0x0;
      pEVar2[lVar3].sheet.pageRules.d.ptr = pPVar12;
      qVar6 = (b->sheet).pageRules.d.size;
      (b->sheet).pageRules.d.size = 0;
      pEVar2[lVar3].sheet.pageRules.d.size = qVar6;
      pDVar13 = (b->sheet).animationRules.d.d;
      (b->sheet).animationRules.d.d = (Data *)0x0;
      pEVar2[lVar3].sheet.animationRules.d.d = pDVar13;
      pAVar14 = (b->sheet).animationRules.d.ptr;
      (b->sheet).animationRules.d.ptr = (AnimationRule *)0x0;
      pEVar2[lVar3].sheet.animationRules.d.ptr = pAVar14;
      qVar6 = (b->sheet).animationRules.d.size;
      (b->sheet).animationRules.d.size = 0;
      pEVar2[lVar3].sheet.animationRules.d.size = qVar6;
      pDVar15 = (b->sheet).importRules.d.d;
      (b->sheet).importRules.d.d = (Data *)0x0;
      pEVar2[lVar3].sheet.importRules.d.d = pDVar15;
      pIVar16 = (b->sheet).importRules.d.ptr;
      (b->sheet).importRules.d.ptr = (ImportRule *)0x0;
      pEVar2[lVar3].sheet.importRules.d.ptr = pIVar16;
      qVar6 = (b->sheet).importRules.d.size;
      (b->sheet).importRules.d.size = 0;
      pEVar2[lVar3].sheet.importRules.d.size = qVar6;
      iVar18 = (b->sheet).depth;
      pEVar2[lVar3].sheet.origin = (b->sheet).origin;
      pEVar2[lVar3].sheet.depth = iVar18;
      pDVar17 = (b->sheet).nameIndex.d;
      (b->sheet).nameIndex.d = (Data *)0x0;
      pEVar2[lVar3].sheet.nameIndex.d = pDVar17;
      qVar6 = (b->sheet).nameIndex.m_size;
      (b->sheet).nameIndex.m_size = 0;
      pEVar2[lVar3].sheet.nameIndex.m_size = qVar6;
      pDVar17 = (b->sheet).idIndex.d;
      (b->sheet).idIndex.d = (Data *)0x0;
      pEVar2[lVar3].sheet.idIndex.d = pDVar17;
      qVar6 = (b->sheet).idIndex.m_size;
      (b->sheet).idIndex.m_size = 0;
      pEVar2[lVar3].sheet.idIndex.m_size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QTextHtmlParser::ExternalStyleSheet>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }